

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglpaintengine.cpp
# Opt level: O0

void __thiscall
QOpenGL2PaintEngineExPrivate::updateClipScissorTest(QOpenGL2PaintEngineExPrivate *this)

{
  long lVar1;
  bool bVar2;
  QRect *this_00;
  QOpenGL2PaintEngineState *pQVar3;
  QOpenGL2PaintEngineExPrivate *in_RDI;
  long in_FS_OFFSET;
  QRect QVar4;
  QOpenGL2PaintEngineEx *q;
  QRect bounds;
  QRect *in_stack_ffffffffffffff58;
  GLenum GVar5;
  int awidth;
  int aleft;
  QRect *in_stack_ffffffffffffff78;
  QOpenGL2PaintEngineExPrivate *in_stack_ffffffffffffff80;
  undefined8 local_38;
  undefined8 local_30;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QRect *)q_func(in_RDI);
  pQVar3 = QOpenGL2PaintEngineEx::state((QOpenGL2PaintEngineEx *)0x16061f);
  GVar5 = (GLenum)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  if ((*(uint *)&pQVar3->field_0x1c0 >> 2 & 1) == 0) {
    QOpenGLFunctions::glDisable((QOpenGLFunctions *)in_RDI,GVar5);
    QOpenGLFunctions::glStencilFunc
              ((QOpenGLFunctions *)in_RDI,(GLenum)((ulong)in_stack_ffffffffffffff58 >> 0x20),
               (GLint)in_stack_ffffffffffffff58,0);
  }
  else {
    QOpenGLFunctions::glEnable((QOpenGLFunctions *)in_RDI,GVar5);
    in_stack_ffffffffffffff58 = (QRect *)&in_RDI->funcs;
    QOpenGL2PaintEngineEx::state((QOpenGL2PaintEngineEx *)0x16065f);
    QOpenGLFunctions::glStencilFunc
              ((QOpenGLFunctions *)in_RDI,(GLenum)((ulong)in_stack_ffffffffffffff58 >> 0x20),
               (GLint)in_stack_ffffffffffffff58,0);
  }
  QOpenGL2PaintEngineEx::state((QOpenGL2PaintEngineEx *)0x1606de);
  pQVar3 = QOpenGL2PaintEngineEx::state((QOpenGL2PaintEngineEx *)0x160706);
  awidth = (int)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  aleft = (int)((ulong)in_RDI >> 0x20);
  if (((byte)pQVar3->field_0x1a0 >> 2 & 1) == 0) {
    if ((in_RDI->useSystemClip & 1U) == 0) {
      QRect::QRect(this_00,aleft,(int)in_RDI,awidth,(int)in_stack_ffffffffffffff58);
      QVar4._8_8_ = local_30;
      QVar4._0_8_ = local_38;
    }
    else {
      QVar4 = (QRect)QRegion::boundingRect();
    }
  }
  else if ((in_RDI->useSystemClip & 1U) == 0) {
    QRect::QRect(this_00,aleft,(int)in_RDI,awidth,(int)in_stack_ffffffffffffff58);
    QVar4 = QRect::intersected((QRect *)in_RDI,in_stack_ffffffffffffff58);
  }
  else {
    QRegion::boundingRect();
    QVar4 = QRect::intersected((QRect *)in_RDI,in_stack_ffffffffffffff58);
  }
  in_RDI->currentScissorBounds = QVar4;
  QRect::QRect(this_00,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
               (int)((ulong)in_stack_ffffffffffffff58 >> 0x20),(int)in_stack_ffffffffffffff58);
  bVar2 = ::operator==((QRect *)in_RDI,in_stack_ffffffffffffff58);
  GVar5 = (GLenum)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  if (bVar2) {
    QOpenGLFunctions::glDisable((QOpenGLFunctions *)in_RDI,GVar5);
  }
  else {
    QOpenGLFunctions::glEnable((QOpenGLFunctions *)in_RDI,GVar5);
    setScissor(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QOpenGL2PaintEngineExPrivate::updateClipScissorTest()
{
    Q_Q(QOpenGL2PaintEngineEx);
    if (q->state()->clipTestEnabled) {
#ifndef QT_NO_DEBUG
        if (ctx->format().stencilBufferSize() <= 0)
            qWarning("OpenGL paint engine: attempted to use stencil test for clipping without requesting a stencil buffer.");
#endif
        funcs.glEnable(GL_STENCIL_TEST);
        funcs.glStencilFunc(GL_LEQUAL, q->state()->currentClip, ~GL_STENCIL_HIGH_BIT);
    } else {
        funcs.glDisable(GL_STENCIL_TEST);
        funcs.glStencilFunc(GL_ALWAYS, 0, 0xff);
    }

#ifdef QT_GL_NO_SCISSOR_TEST
    currentScissorBounds = QRect(0, 0, width, height);
#else
    QRect bounds = q->state()->rectangleClip;
    if (!q->state()->clipEnabled) {
        if (useSystemClip)
            bounds = systemClip.boundingRect();
        else
            bounds = QRect(0, 0, width, height);
    } else {
        if (useSystemClip)
            bounds = bounds.intersected(systemClip.boundingRect());
        else
            bounds = bounds.intersected(QRect(0, 0, width, height));
    }

    currentScissorBounds = bounds;

    if (bounds == QRect(0, 0, width, height)) {
        funcs.glDisable(GL_SCISSOR_TEST);
    } else {
        funcs.glEnable(GL_SCISSOR_TEST);
        setScissor(bounds);
    }
#endif
}